

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

void __thiscall QProcessPrivate::start(QProcessPrivate *this,OpenMode mode)

{
  ProcessChannelType PVar1;
  QObject *this_00;
  QObjectData *pQVar2;
  QArrayData *data;
  bool bVar3;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar4;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar5;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar4.i = (uint)mode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0xfffffffd;
  if ((this->stdinChannel).type == Normal) {
    QVar4.i = (Int)mode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                   super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
  }
  PVar1 = (this->stdoutChannel).type;
  QVar5.i = QVar4.i;
  if (PVar1 != Normal) {
    if (this->processChannelMode == '\x01') {
      QVar5.i = QVar4.i & 0xfffffffe;
    }
    if ((this->stderrChannel).type != Normal) {
      QVar5.i = QVar4.i & 0xfffffffe;
    }
  }
  this_00 = (this->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  if (QVar5.i == 0) {
    QVar5.i = 0x20;
  }
  else if ((QVar5.i & 1) != 0) goto LAB_0041d741;
  if (PVar1 == Normal) {
    local_50.d.d = (Data *)0x0;
    local_50.d.ptr = L"/dev/null";
    local_50.d.size = 9;
    pQVar2 = (this_00->d_ptr).d;
    Channel::clear((Channel *)&pQVar2[5].field_0x30);
    QString::operator=((QString *)&pQVar2[5].field_0x30,&local_50);
    *(char *)&pQVar2[6].parent = (local_50.d.size != 0) * '\x03';
    *(undefined1 *)((long)&pQVar2[6].parent + 2) = 0;
    in_EDX = extraout_EDX_01;
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        in_EDX = extraout_EDX_02;
      }
    }
  }
  if (((this->stderrChannel).type == Normal) && (this->processChannelMode != '\x01')) {
    local_50.d.d = (Data *)0x0;
    local_50.d.ptr = L"/dev/null";
    local_50.d.size = 9;
    pQVar2 = (this_00->d_ptr).d;
    Channel::clear((Channel *)&pQVar2[6].children);
    QString::operator=((QString *)&pQVar2[6].children,&local_50);
    *(char *)&pQVar2[6].bindingStorage.bindingStatus = (local_50.d.size != 0) * '\x03';
    *(undefined1 *)((long)&pQVar2[6].bindingStorage.bindingStatus + 2) = 0;
    in_EDX = extraout_EDX;
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        in_EDX = extraout_EDX_00;
      }
    }
  }
LAB_0041d741:
  QIODevice::open((QIODevice *)this_00,(char *)(ulong)QVar5.i,in_EDX);
  bVar3 = QIODevice::isReadable((QIODevice *)this_00);
  if ((bVar3) && (this->processChannelMode != '\x01')) {
    QIODevicePrivate::setReadChannelCount(&this->super_QIODevicePrivate,2);
  }
  (this->stdinChannel).closed = false;
  (this->stdoutChannel).closed = false;
  (this->stderrChannel).closed = false;
  this->exitCode = 0;
  this->exitStatus = '\0';
  this->processError = '\x05';
  if ((this->super_QIODevicePrivate).errorString.d.ptr != (char16_t *)0x0) {
    data = &((this->super_QIODevicePrivate).errorString.d.d)->super_QArrayData;
    (this->super_QIODevicePrivate).errorString.d.d = (Data *)0x0;
    (this->super_QIODevicePrivate).errorString.d.ptr = (char16_t *)0x0;
    (this->super_QIODevicePrivate).errorString.d.size = 0;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  startProcess(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProcessPrivate::start(QIODevice::OpenMode mode)
{
    Q_Q(QProcess);
#if defined QPROCESS_DEBUG
    qDebug() << "QProcess::start(" << program << ',' << arguments << ',' << mode << ')';
#endif

    if (stdinChannel.type != QProcessPrivate::Channel::Normal)
        mode &= ~QIODevice::WriteOnly;     // not open for writing
    if (stdoutChannel.type != QProcessPrivate::Channel::Normal &&
        (stderrChannel.type != QProcessPrivate::Channel::Normal ||
         processChannelMode == QProcess::MergedChannels))
        mode &= ~QIODevice::ReadOnly;      // not open for reading
    if (mode == 0)
        mode = QIODevice::Unbuffered;
    if ((mode & QIODevice::ReadOnly) == 0) {
        if (stdoutChannel.type == QProcessPrivate::Channel::Normal)
            q->setStandardOutputFile(q->nullDevice());
        if (stderrChannel.type == QProcessPrivate::Channel::Normal
            && processChannelMode != QProcess::MergedChannels)
            q->setStandardErrorFile(q->nullDevice());
    }

    q->QIODevice::open(mode);

    if (q->isReadable() && processChannelMode != QProcess::MergedChannels)
        setReadChannelCount(2);

    stdinChannel.closed = false;
    stdoutChannel.closed = false;
    stderrChannel.closed = false;

    exitCode = 0;
    exitStatus = QProcess::NormalExit;
    processError = QProcess::UnknownError;
    errorString.clear();
    startProcess();
}